

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

idx_t duckdb::BitStringAggOperation::GetRange<signed_char>(char min,char max)

{
  bool bVar1;
  unsigned_long uVar2;
  idx_t iVar3;
  InvalidInputException *this;
  allocator local_41;
  char result;
  
  if (max < min) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&result,"Invalid explicit bitstring range: Minimum (%d) > maximum (%d)",
               &local_41);
    InvalidInputException::InvalidInputException<signed_char,signed_char>
              (this,(string *)&result,min,max);
    __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TrySubtractOperator::Operation<signed_char,signed_char,signed_char>(max,min,&result);
  if (bVar1) {
    uVar2 = NumericCastImpl<unsigned_long,_signed_char,_false>::Convert(result);
    iVar3 = 0xffffffffffffffff;
    if (uVar2 + 1 != 0) {
      iVar3 = uVar2 + 1;
    }
  }
  else {
    iVar3 = 0xffffffffffffffff;
  }
  return iVar3;
}

Assistant:

static idx_t GetRange(INPUT_TYPE min, INPUT_TYPE max) {
		if (min > max) {
			throw InvalidInputException("Invalid explicit bitstring range: Minimum (%d) > maximum (%d)", min, max);
		}
		INPUT_TYPE result;
		if (!TrySubtractOperator::Operation(max, min, result)) {
			return NumericLimits<idx_t>::Maximum();
		}
		auto val = NumericCast<idx_t>(result);
		if (val == NumericLimits<idx_t>::Maximum()) {
			return val;
		}
		return val + 1;
	}